

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::MemoryStressCase::iterate(MemoryStressCase *this)

{
  MemObjectType objectTypes;
  RenderContext *renderContext;
  bool bVar1;
  deUint32 dVar2;
  GLenum GVar3;
  deBool dVar4;
  int iVar5;
  Result RVar6;
  TestLog *log_00;
  char *str;
  MessageBuilder *pMVar7;
  float *pfVar8;
  reference pvVar9;
  size_type sVar10;
  MessageBuilder local_a30;
  float local_8ac;
  undefined1 local_8a8 [4];
  float change;
  int local_728;
  float local_724;
  int allocNdx;
  float threshold;
  int max;
  int min;
  char *local_710;
  MessageBuilder local_708;
  MessageBuilder local_588;
  deUint32 local_408;
  int local_404;
  MessageBuilder local_400;
  int local_27c [3];
  MessageBuilder local_270;
  undefined1 local_e0 [8];
  MemObjectAllocator allocator;
  TestLog *log;
  bool end;
  MemoryStressCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  renderContext = this->m_renderCtx;
  objectTypes = this->m_objectTypes;
  allocator.m_textureRenderer._24_8_ = log_00;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  MemObjectAllocator::MemObjectAllocator
            ((MemObjectAllocator *)local_e0,log_00,renderContext,objectTypes,&this->m_config,dVar2);
  bVar1 = MemObjectAllocator::allocUntilFailure((MemObjectAllocator *)local_e0);
  if (bVar1) {
    if ((this->m_clearAfterOOM & 1U) != 0) {
      do {
        glwClear(0x4500);
        GVar3 = glwGetError();
        glu::checkError(GVar3,
                        "glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0x36c);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    MemObjectAllocator::clearObjects((MemObjectAllocator *)local_e0);
    local_27c[0] = MemObjectAllocator::getObjectCount((MemObjectAllocator *)local_e0);
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_allocated,local_27c);
    if ((this->m_iteration != 0) &&
       (iVar5 = MemObjectAllocator::getObjectCount((MemObjectAllocator *)local_e0), iVar5 == 0)) {
      this->m_zeroAlloc = true;
    }
    tcu::TestLog::operator<<
              (&local_400,(TestLog *)allocator.m_textureRenderer._24_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_400,(char (*) [41])"Got error when allocation object count: ");
    local_404 = MemObjectAllocator::getObjectCount((MemObjectAllocator *)local_e0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_404);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])" bytes: ");
    local_408 = MemObjectAllocator::getBytes((MemObjectAllocator *)local_e0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_408);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_400);
    dVar2 = MemObjectAllocator::getGLError((MemObjectAllocator *)local_e0);
    if ((dVar2 == 0) &&
       (RVar6 = MemObjectAllocator::getResult((MemObjectAllocator *)local_e0),
       RVar6 == RESULT_GOT_BAD_ALLOC)) {
      tcu::TestLog::operator<<
                (&local_588,(TestLog *)allocator.m_textureRenderer._24_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [15])0xaf9adc);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_588);
      bVar1 = true;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_RESOURCE_ERROR,
                 "Memory allocation failed");
    }
    else {
      dVar2 = MemObjectAllocator::getGLError((MemObjectAllocator *)local_e0);
      bVar1 = dVar2 != 0x505;
      if (bVar1) {
        tcu::TestLog::operator<<
                  (&local_708,(TestLog *)allocator.m_textureRenderer._24_8_,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_708,(char (*) [15])"Invalid Error ");
        RVar6 = MemObjectAllocator::getResult((MemObjectAllocator *)local_e0);
        local_710 = MemObjectAllocator::resultToString(RVar6);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_710);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [11])" GLError: ");
        dVar2 = MemObjectAllocator::getGLError((MemObjectAllocator *)local_e0);
        _max = glErrorToString(dVar2);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&max);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_708);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
      }
    }
    if (this->m_iteration + 1 == this->m_iterationCount) {
      pfVar8 = (float *)std::vector<int,_std::allocator<int>_>::operator[](&this->m_allocated,0);
      threshold = *pfVar8;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_allocated,0);
      allocNdx = *pvVar9;
      local_724 = 50.0;
      for (local_728 = 0; iVar5 = local_728,
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&this->m_allocated),
          iVar5 < (int)sVar10; local_728 = local_728 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_allocated,(long)local_728);
        threshold = (float)::deMin32(*pvVar9,(int)threshold);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_allocated,(long)local_728);
        allocNdx = deMax32(*pvVar9,allocNdx);
      }
      if ((threshold == 0.0) && (allocNdx != 0)) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_8a8,(TestLog *)allocator.m_textureRenderer._24_8_,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_8a8,(char (*) [22])"Allocation count zero");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_8a8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        local_8ac = (float)((int)threshold - allocNdx) / (float)allocNdx;
        if (local_8ac <= local_724) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          tcu::TestLog::operator<<
                    (&local_a30,(TestLog *)allocator.m_textureRenderer._24_8_,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_a30,(char (*) [24])"Allocated objects max: ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&allocNdx);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])", min: ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&threshold);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])", difference: ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_8ac);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])"% threshold: ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_724);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xaec889);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_a30);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_QUALITY_WARNING,
                     "Allocation count variation");
        }
      }
      bVar1 = true;
    }
    do {
      glwFinish();
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x3a7);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    this->m_iteration = this->m_iteration + 1;
    if (bVar1) {
      this_local._4_4_ = STOP;
    }
    else {
      this_local._4_4_ = CONTINUE;
    }
  }
  else {
    MemObjectAllocator::clearObjects((MemObjectAllocator *)local_e0);
    tcu::TestLog::operator<<
              (&local_270,(TestLog *)allocator.m_textureRenderer._24_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_270,
                        (char (*) [58])"Timeout. Couldn\'t exhaust memory in timelimit. Allocated ")
    ;
    local_27c[2] = MemObjectAllocator::getObjectCount((MemObjectAllocator *)local_e0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_27c + 2);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])" objects.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_270);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    this_local._4_4_ = STOP;
  }
  local_27c[1] = 1;
  MemObjectAllocator::~MemObjectAllocator((MemObjectAllocator *)local_e0);
  return this_local._4_4_;
}

Assistant:

tcu::TestCase::IterateResult MemoryStressCase::iterate (void)
{
	bool			end		= false;
	tcu::TestLog&	log		= m_testCtx.getLog();

	MemObjectAllocator allocator(log, m_renderCtx, m_objectTypes, m_config, deStringHash(getName()));

	if (!allocator.allocUntilFailure())
	{
		// Allocation timed out
		allocator.clearObjects();

		log << TestLog::Message << "Timeout. Couldn't exhaust memory in timelimit. Allocated " << allocator.getObjectCount() << " objects." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	// Try to cancel rendering operations
	if (m_clearAfterOOM)
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

	allocator.clearObjects();

	m_allocated.push_back(allocator.getObjectCount());

	if (m_iteration != 0  && allocator.getObjectCount() == 0)
		m_zeroAlloc = true;

	log << TestLog::Message << "Got error when allocation object count: " << allocator.getObjectCount() << " bytes: " << allocator.getBytes() << TestLog::EndMessage;

	if ((allocator.getGLError() == 0) && (allocator.getResult() == MemObjectAllocator::RESULT_GOT_BAD_ALLOC))
	{
		log << TestLog::Message << "std::bad_alloc" << TestLog::EndMessage;
		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Memory allocation failed");
	}
	else if (allocator.getGLError() != GL_OUT_OF_MEMORY)
	{
		log << TestLog::Message << "Invalid Error " << MemObjectAllocator::resultToString(allocator.getResult())
			<< " GLError: " << glErrorToString(allocator.getGLError()) <<
		TestLog::EndMessage;

		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	if ((m_iteration+1) == m_iterationCount)
	{
		int min = m_allocated[0];
		int max = m_allocated[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocated.size(); allocNdx++)
		{
			min = deMin32(m_allocated[allocNdx], min);
			max = deMax32(m_allocated[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			const float change = (float)(min - max) / (float)(max);
			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		end = true;
	}

	GLU_CHECK_CALL(glFinish());

	m_iteration++;
	if (end)
		return STOP;
	else
		return CONTINUE;
}